

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void slideWindows(double ax,double ay,double az,double gx,double gy,double gz,double mx,double my,
                 double mz,double GPSyaw,double GPSv)

{
  int local_50;
  int local_4c;
  int i_1;
  int i;
  double my_local;
  double mx_local;
  double gz_local;
  double gy_local;
  double gx_local;
  double az_local;
  double ay_local;
  double ax_local;
  
  if (firstSmooth == 0) {
    for (local_4c = 0; local_4c < 0xc; local_4c = local_4c + 1) {
      (**smoothRes)[local_4c] = ax;
      (*smoothRes)[1][local_4c] = ay;
      (*smoothRes)[2][local_4c] = az;
      (*smoothRes[1])[local_4c] = gx;
      smoothRes[1][1][local_4c] = gy;
      smoothRes[1][2][local_4c] = gz;
      (*smoothRes[2])[local_4c] = mx;
      smoothRes[2][1][local_4c] = my;
      smoothRes[2][2][local_4c] = mz;
      (*smoothRes[3])[local_4c] = GPSyaw;
      smoothRes[3][1][local_4c] = GPSv;
    }
    firstSmooth = 1;
  }
  else {
    for (local_50 = 1; local_50 < 0xc; local_50 = local_50 + 1) {
      (**smoothRes)[local_50 + -1] = (**smoothRes)[local_50];
      (*smoothRes)[1][local_50 + -1] = (*smoothRes)[1][local_50];
      (*smoothRes)[2][local_50 + -1] = (*smoothRes)[2][local_50];
      (*smoothRes[1])[local_50 + -1] = (*smoothRes[1])[local_50];
      smoothRes[1][1][local_50 + -1] = smoothRes[1][1][local_50];
      smoothRes[1][2][local_50 + -1] = smoothRes[1][2][local_50];
      (*smoothRes[2])[local_50 + -1] = (*smoothRes[2])[local_50];
      smoothRes[2][1][local_50 + -1] = smoothRes[2][1][local_50];
      smoothRes[2][2][local_50 + -1] = smoothRes[2][2][local_50];
      (*smoothRes[3])[local_50 + -1] = (*smoothRes[3])[local_50];
      smoothRes[3][1][local_50 + -1] = smoothRes[3][1][local_50];
    }
    (**smoothRes)[0xb] = ax;
    (*smoothRes)[1][0xb] = ay;
    (*smoothRes)[2][0xb] = az;
    (*smoothRes[1])[0xb] = gx;
    smoothRes[1][1][0xb] = gy;
    smoothRes[1][2][0xb] = gz;
    (*smoothRes[2])[0xb] = mx;
    smoothRes[2][1][0xb] = my;
    smoothRes[2][2][0xb] = mz;
    (*smoothRes[3])[0xb] = GPSyaw;
    smoothRes[3][1][0xb] = GPSv;
  }
  return;
}

Assistant:

void slideWindows(double ax, double ay, double az, double gx, double gy, double gz, double mx, double my, double mz,
                  double GPSyaw, double GPSv) {
    if (firstSmooth == 0) {
        for (int i = 0; i < width; i++) {
            smoothRes[0][0][i] = ax;
            smoothRes[0][1][i] = ay;
            smoothRes[0][2][i] = az;
            smoothRes[1][0][i] = gx;
            smoothRes[1][1][i] = gy;
            smoothRes[1][2][i] = gz;
            smoothRes[2][0][i] = mx;
            smoothRes[2][1][i] = my;
            smoothRes[2][2][i] = mz;
            smoothRes[3][0][i] = GPSyaw;
            smoothRes[3][1][i] = GPSv;
        }
        firstSmooth = 1;
    } else {
        for (int i = 1; i < width; i++) {
            smoothRes[0][0][i - 1] = smoothRes[0][0][i];
            smoothRes[0][1][i - 1] = smoothRes[0][1][i];
            smoothRes[0][2][i - 1] = smoothRes[0][2][i];
            smoothRes[1][0][i - 1] = smoothRes[1][0][i];
            smoothRes[1][1][i - 1] = smoothRes[1][1][i];
            smoothRes[1][2][i - 1] = smoothRes[1][2][i];
            smoothRes[2][0][i - 1] = smoothRes[2][0][i];
            smoothRes[2][1][i - 1] = smoothRes[2][1][i];
            smoothRes[2][2][i - 1] = smoothRes[2][2][i];
            smoothRes[3][0][i - 1] = smoothRes[3][0][i];
            smoothRes[3][1][i - 1] = smoothRes[3][1][i];
        }
        smoothRes[0][0][width - 1] = ax;
        smoothRes[0][1][width - 1] = ay;
        smoothRes[0][2][width - 1] = az;
        smoothRes[1][0][width - 1] = gx;
        smoothRes[1][1][width - 1] = gy;
        smoothRes[1][2][width - 1] = gz;
        smoothRes[2][0][width - 1] = mx;
        smoothRes[2][1][width - 1] = my;
        smoothRes[2][2][width - 1] = mz;
        smoothRes[3][0][width - 1] = GPSyaw;
        smoothRes[3][1][width - 1] = GPSv;
    }
}